

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall
google::protobuf::DescriptorPool::IsSubSymbolOfBuiltType(DescriptorPool *this,string *name)

{
  pointer pcVar1;
  Tables *pTVar2;
  bool bVar3;
  long lVar4;
  const_iterator cVar5;
  char cVar6;
  string prefix;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar1,pcVar1 + name->_M_string_length);
  do {
    lVar4 = std::__cxx11::string::rfind((char)(string *)local_70,0x2e);
    if (lVar4 == -1) {
      cVar6 = '\x02';
    }
    else {
      std::__cxx11::string::substr((ulong)local_50,(ulong)local_70);
      std::__cxx11::string::operator=((string *)local_70,(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      pTVar2 = (this->tables_).ptr_;
      if (pTVar2 == (Tables *)0x0) {
        __assert_fail("ptr_ != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/scoped_ptr.h"
                      ,0x5f,
                      "C *google::protobuf::internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->() const [C = google::protobuf::DescriptorPool::Tables]"
                     );
      }
      local_50[0] = local_70[0];
      cVar5 = std::
              _Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)&pTVar2->symbols_by_name_,(key_type *)local_50);
      cVar6 = '\0';
      if (cVar5.
          super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>.
          _M_cur != (__node_type *)0x0) {
        cVar6 = (*(uint *)((long)cVar5.
                                 super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>
                                 ._M_cur + 0x10) & 0xfffffff7) != 0;
      }
    }
    if (cVar6 != '\0') {
      if (cVar6 == '\x02') {
        if (this->underlay_ == (DescriptorPool *)0x0) {
          bVar3 = false;
        }
        else {
          bVar3 = IsSubSymbolOfBuiltType(this->underlay_,name);
        }
      }
      else {
        bVar3 = true;
      }
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      return bVar3;
    }
  } while( true );
}

Assistant:

bool DescriptorPool::IsSubSymbolOfBuiltType(const string& name) const {
  string prefix = name;
  for (;;) {
    string::size_type dot_pos = prefix.find_last_of('.');
    if (dot_pos == string::npos) {
      break;
    }
    prefix = prefix.substr(0, dot_pos);
    Symbol symbol = tables_->FindSymbol(prefix);
    // If the symbol type is anything other than PACKAGE, then its complete
    // definition is already known.
    if (!symbol.IsNull() && symbol.type != Symbol::PACKAGE) {
      return true;
    }
  }
  if (underlay_ != NULL) {
    // Check to see if any prefix of this symbol exists in the underlay.
    return underlay_->IsSubSymbolOfBuiltType(name);
  }
  return false;
}